

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

int Acb_NtkComputePathsD(Acb_Ntk_t *p,Vec_Int_t *vTfo,int fReverse)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  if ((p->vPathD).nSize < 1) {
    Vec_IntFill(&p->vPathD,(p->vObjType).nCap,0);
  }
  if (fReverse == 0) {
    for (iVar5 = 0; iVar5 < vTfo->nSize; iVar5 = iVar5 + 1) {
      iVar1 = Vec_IntEntry(vTfo,iVar5);
      iVar2 = Acb_ObjIsCi(p,iVar1);
      iVar3 = Acb_ObjSlack(p,iVar1);
      if (iVar2 == 0) {
        if (iVar3 != 0) {
          uVar4 = 0;
          goto LAB_00316093;
        }
        Acb_ObjComputePathD(p,iVar1);
      }
      else {
        uVar4 = (uint)(iVar3 == 0);
LAB_00316093:
        Vec_IntWriteEntry(&p->vPathD,iVar1,uVar4);
      }
    }
  }
  else {
    iVar5 = vTfo->nSize;
    while (0 < iVar5) {
      iVar5 = iVar5 + -1;
      iVar1 = Vec_IntEntry(vTfo,iVar5);
      iVar2 = Acb_ObjIsCi(p,iVar1);
      iVar3 = Acb_ObjSlack(p,iVar1);
      if (iVar2 == 0) {
        if (iVar3 != 0) {
          uVar4 = 0;
          goto LAB_0031602b;
        }
        Acb_ObjComputePathD(p,iVar1);
      }
      else {
        uVar4 = (uint)(iVar3 == 0);
LAB_0031602b:
        Vec_IntWriteEntry(&p->vPathD,iVar1,uVar4);
      }
    }
  }
  iVar5 = 0;
  for (iVar1 = 0; iVar1 < (p->vCos).nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(&p->vCos,iVar1);
    iVar2 = Acb_ObjPathD(p,iVar2);
    iVar5 = iVar5 + iVar2;
  }
  p->nPaths = iVar5;
  return iVar5;
}

Assistant:

int Acb_NtkComputePathsD( Acb_Ntk_t * p, Vec_Int_t * vTfo, int fReverse )
{
    int i, iObj, Path = 0;
    //Vec_IntPrint( vTfo );
    if ( !Acb_NtkHasObjPathD( p ) )
        Acb_NtkCleanObjPathD( p );
    // it is assumed that vTfo contains CI nodes
    //assert( Acb_ObjSlack(p, Vec_IntEntry(vTfo, 0)) );
    if ( fReverse )
    {
        Vec_IntForEachEntryReverse( vTfo, iObj, i )
        {
            if ( Acb_ObjIsCi(p, iObj) )
                Acb_ObjSetPathD( p, iObj, Acb_ObjSlack(p, iObj) == 0 );
            else if ( Acb_ObjSlack(p, iObj) )
                Acb_ObjSetPathD( p, iObj, 0 );
            else
                Acb_ObjComputePathD( p, iObj );
        }
    }
    else
    {
        Vec_IntForEachEntry( vTfo, iObj, i )
        {
            if ( Acb_ObjIsCi(p, iObj) )
                Acb_ObjSetPathD( p, iObj, Acb_ObjSlack(p, iObj) == 0 );
            else if ( Acb_ObjSlack(p, iObj) )
                Acb_ObjSetPathD( p, iObj, 0 );
            else
                Acb_ObjComputePathD( p, iObj );
        }
    }
    Acb_NtkForEachCo( p, iObj, i )
        Path += Acb_ObjPathD(p, iObj);
    p->nPaths = Path;
    return Path;
}